

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

__int128 * __thiscall
calculator::ExpressionParser<__int128>::getInteger
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this)

{
  char cVar1;
  __int128 *p_Var2;
  
  if (*(ulong *)(__return_storage_ptr__ + 2) < *(ulong *)((long)__return_storage_ptr__ + 8)) {
    cVar1 = *(char *)((long)*__return_storage_ptr__ + *(ulong *)(__return_storage_ptr__ + 2));
  }
  else {
    cVar1 = '\0';
  }
  p_Var2 = toInteger((__int128 *)(ulong)(uint)(int)cVar1,(char)this);
  return p_Var2;
}

Assistant:

bool isEnd() const
  {
    return index_ >= expr_.size();
  }